

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

size_t WitnessSigOps(int witversion,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *witprogram,
                    CScriptWitness *witness)

{
  uint uVar1;
  long in_RCX;
  size_t sVar2;
  long in_R8;
  long in_FS_OFFSET;
  direct_or_indirect local_30;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (witversion == 0) {
    if ((long)witness - (long)witprogram == 0x14) {
      sVar2 = 1;
      goto LAB_001ed72d;
    }
    if (((long)witness - (long)witprogram == 0x20) && (in_R8 != in_RCX)) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_30.indirect_contents,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)(in_R8 + -0x18),
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)(in_R8 + -0x10));
      uVar1 = CScript::GetSigOpCount((CScript *)&local_30.indirect_contents,true);
      sVar2 = (size_t)uVar1;
      if (0x1c < local_14) {
        free(local_30.indirect_contents.indirect);
      }
      goto LAB_001ed72d;
    }
  }
  sVar2 = 0;
LAB_001ed72d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t static WitnessSigOps(int witversion, const std::vector<unsigned char>& witprogram, const CScriptWitness& witness)
{
    if (witversion == 0) {
        if (witprogram.size() == WITNESS_V0_KEYHASH_SIZE)
            return 1;

        if (witprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE && witness.stack.size() > 0) {
            CScript subscript(witness.stack.back().begin(), witness.stack.back().end());
            return subscript.GetSigOpCount(true);
        }
    }

    // Future flags may be implemented here.
    return 0;
}